

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

void __thiscall
ON_Mesh::InvalidateCachedTextureCoordinates
          (ON_Mesh *this,bool bOnlyInvalidateCachedSurfaceParameterMapping)

{
  undefined7 in_register_00000031;
  uint i;
  
  if ((int)CONCAT71(in_register_00000031,bOnlyInvalidateCachedSurfaceParameterMapping) != 0) {
    i = (this->m_TC).m_count;
    while (0 < (int)i) {
      i = i - 1;
      if ((this->m_TC).m_a[i].m_tag.m_mapping_type == srfp_mapping) {
        ON_ClassArray<ON_TextureCoordinates>::Remove(&this->m_TC,i);
      }
    }
    return;
  }
  ON_ClassArray<ON_TextureCoordinates>::Destroy(&this->m_TC);
  return;
}

Assistant:

void ON_Mesh::InvalidateCachedTextureCoordinates(bool bOnlyInvalidateCachedSurfaceParameterMapping)
{
  if (bOnlyInvalidateCachedSurfaceParameterMapping)
  {
    for (int i = m_TC.Count() - 1; i >= 0; i--)
    {
      if (m_TC[i].m_tag.m_mapping_type == ON_TextureMapping::TYPE::srfp_mapping)
      {
        m_TC.Remove(i);
      }
    }
  }
  else
  {
    m_TC.Destroy();
  }
}